

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O1

string * __thiscall
flatbuffers::cpp::CppGenerator::UnionPackSignature_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,EnumDef *enum_def,bool inclass)

{
  long lVar1;
  long *plVar2;
  undefined8 *puVar3;
  undefined7 in_register_00000009;
  long *plVar4;
  ulong *puVar5;
  size_type *psVar6;
  ulong uVar7;
  undefined8 uVar8;
  long *local_150;
  undefined8 local_148;
  long local_140;
  undefined8 uStack_138;
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  string local_f0;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  if ((int)CONCAT71(in_register_00000009,inclass) == 0) {
    EscapeKeyword(&local_50,this,(string *)enum_def);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_110 = &local_100;
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_100 = *plVar4;
      lStack_f8 = plVar2[3];
    }
    else {
      local_100 = *plVar4;
      local_110 = (long *)*plVar2;
    }
    local_108 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
  }
  else {
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110);
  }
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,0x368266);
  local_d0 = &local_c0;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_c0 = *plVar4;
    lStack_b8 = plVar2[3];
  }
  else {
    local_c0 = *plVar4;
    local_d0 = (long *)*plVar2;
  }
  local_c8 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_120 = *puVar5;
    lStack_118 = plVar2[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar5;
    local_130 = (ulong *)*plVar2;
  }
  local_128 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  GetBuilder_abi_cxx11_(&local_f0,this);
  uVar7 = 0xf;
  if (local_130 != &local_120) {
    uVar7 = local_120;
  }
  if (uVar7 < local_f0._M_string_length + local_128) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar8 = local_f0.field_2._M_allocated_capacity;
    }
    if (local_f0._M_string_length + local_128 <= (ulong)uVar8) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_130);
      goto LAB_001828ad;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_f0._M_dataplus._M_p);
LAB_001828ad:
  local_150 = &local_140;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_140 = *plVar2;
    uStack_138 = puVar3[3];
  }
  else {
    local_140 = *plVar2;
    local_150 = (long *)*puVar3;
  }
  local_148 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_150);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_a0 = *plVar4;
    lStack_98 = plVar2[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar4;
    local_b0 = (long *)*plVar2;
  }
  local_a8 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_80 = *plVar4;
    lStack_78 = plVar2[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar4;
    local_90 = (long *)*plVar2;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_60 = *plVar4;
    lStack_58 = plVar2[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar4;
    local_70 = (long *)*plVar2;
  }
  local_68 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar6) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if ((!inclass) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string UnionPackSignature(const EnumDef &enum_def, bool inclass) {
    return "::flatbuffers::Offset<void> " +
           (inclass ? "" : Name(enum_def) + "Union::") + "Pack(" +
           GetBuilder() + " &_fbb, " +
           "const ::flatbuffers::rehasher_function_t *_rehasher" +
           (inclass ? " = nullptr" : "") + ") const";
  }